

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

VkResult __thiscall myvk::Device::create_allocator(Device *this)

{
  element_type *peVar1;
  VkResult VVar2;
  VmaAllocatorCreateInfo create_info;
  VmaAllocatorCreateInfo local_128;
  VmaVulkanFunctions local_d0;
  
  local_128.pVulkanFunctions = &local_d0;
  local_d0.vkGetInstanceProcAddr = vkGetInstanceProcAddr;
  local_d0.vkGetDeviceProcAddr = vkGetDeviceProcAddr;
  local_d0.vkGetPhysicalDeviceProperties = vkGetPhysicalDeviceProperties;
  local_d0.vkGetPhysicalDeviceMemoryProperties = vkGetPhysicalDeviceMemoryProperties;
  local_d0.vkAllocateMemory = vkAllocateMemory;
  local_d0.vkFreeMemory = vkFreeMemory;
  local_d0.vkMapMemory = vkMapMemory;
  local_d0.vkUnmapMemory = vkUnmapMemory;
  local_d0.vkFlushMappedMemoryRanges = vkFlushMappedMemoryRanges;
  local_d0.vkInvalidateMappedMemoryRanges = vkInvalidateMappedMemoryRanges;
  local_d0.vkBindBufferMemory = vkBindBufferMemory;
  local_d0.vkBindImageMemory = vkBindImageMemory;
  local_d0.vkGetBufferMemoryRequirements = vkGetBufferMemoryRequirements;
  local_d0.vkGetImageMemoryRequirements = vkGetImageMemoryRequirements;
  local_d0.vkCreateBuffer = vkCreateBuffer;
  local_d0.vkDestroyBuffer = vkDestroyBuffer;
  local_d0.vkCreateImage = vkCreateImage;
  local_d0.vkDestroyImage = vkDestroyImage;
  local_d0.vkCmdCopyBuffer = vkCmdCopyBuffer;
  local_d0.vkGetBufferMemoryRequirements2KHR = vkGetBufferMemoryRequirements2KHR;
  local_d0.vkGetImageMemoryRequirements2KHR = vkGetImageMemoryRequirements2KHR;
  local_d0.vkBindBufferMemory2KHR = vkBindBufferMemory2KHR;
  local_d0.vkBindImageMemory2KHR = vkBindImageMemory2KHR;
  local_d0.vkGetPhysicalDeviceMemoryProperties2KHR = vkGetPhysicalDeviceMemoryProperties2KHR;
  local_d0.vkGetDeviceBufferMemoryRequirements = (PFN_vkGetDeviceBufferMemoryRequirements)0x0;
  local_d0.vkGetDeviceImageMemoryRequirements = (PFN_vkGetDeviceImageMemoryRequirements)0x0;
  local_128.vulkanApiVersion = 0;
  local_128._76_4_ = 0;
  local_128.pHeapSizeLimit = (VkDeviceSize *)0x0;
  local_128.pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_128.pDeviceMemoryCallbacks = (VmaDeviceMemoryCallbacks *)0x0;
  local_128.preferredLargeHeapBlockSize = 0;
  local_128.flags = 0;
  local_128._4_4_ = 0;
  local_128.pTypeExternalMemoryHandleTypes = (VkExternalMemoryHandleTypeFlagsKHR *)0x0;
  peVar1 = (this->m_physical_device_ptr).
           super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128.instance =
       ((peVar1->m_instance_ptr).super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->m_instance;
  local_128.device = this->m_device;
  local_128.physicalDevice = peVar1->m_physical_device;
  VVar2 = vmaCreateAllocator(&local_128,&this->m_allocator);
  return VVar2;
}

Assistant:

VkResult Device::create_allocator() {
	VmaVulkanFunctions vk_funcs = {
		/// Required when using VMA_DYNAMIC_VULKAN_FUNCTIONS.
		vkGetInstanceProcAddr,
		/// Required when using VMA_DYNAMIC_VULKAN_FUNCTIONS.
		vkGetDeviceProcAddr,
		vkGetPhysicalDeviceProperties,
		vkGetPhysicalDeviceMemoryProperties,
		vkAllocateMemory,
		vkFreeMemory,
		vkMapMemory,
		vkUnmapMemory,
		vkFlushMappedMemoryRanges,
		vkInvalidateMappedMemoryRanges,
		vkBindBufferMemory,
		vkBindImageMemory,
		vkGetBufferMemoryRequirements,
		vkGetImageMemoryRequirements,
		vkCreateBuffer,
		vkDestroyBuffer,
		vkCreateImage,
		vkDestroyImage,
		vkCmdCopyBuffer,
#if VMA_DEDICATED_ALLOCATION || VMA_VULKAN_VERSION >= 1001000
		/// Fetch "vkGetBufferMemoryRequirements2" on Vulkan >= 1.1, fetch "vkGetBufferMemoryRequirements2KHR" when
		/// using
		/// VK_KHR_dedicated_allocation extension.
		vkGetBufferMemoryRequirements2KHR,
		/// Fetch "vkGetImageMemoryRequirements 2" on Vulkan >= 1.1, fetch "vkGetImageMemoryRequirements2KHR" when using
		/// VK_KHR_dedicated_allocation extension.
		vkGetImageMemoryRequirements2KHR,
#endif
#if VMA_BIND_MEMORY2 || VMA_VULKAN_VERSION >= 1001000
		/// Fetch "vkBindBufferMemory2" on Vulkan >= 1.1, fetch "vkBindBufferMemory2KHR" when using VK_KHR_bind_memory2
		/// extension.
		vkBindBufferMemory2KHR,
		/// Fetch "vkBindImageMemory2" on Vulkan >= 1.1, fetch "vkBindImageMemory2KHR" when using VK_KHR_bind_memory2
		/// extension.
		vkBindImageMemory2KHR,
#endif
#if VMA_MEMORY_BUDGET || VMA_VULKAN_VERSION >= 1001000
		vkGetPhysicalDeviceMemoryProperties2KHR,
#endif
	};

	VmaAllocatorCreateInfo create_info = {};
	create_info.instance = m_physical_device_ptr->GetInstancePtr()->GetHandle();
	create_info.device = m_device;
	create_info.physicalDevice = m_physical_device_ptr->GetHandle();
	create_info.pVulkanFunctions = &vk_funcs;

	return vmaCreateAllocator(&create_info, &m_allocator);
}